

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  undefined8 b;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *pcVar2;
  string_view sVar3;
  string_view title;
  string_view title_00;
  string_view title_01;
  lock_guard<std::mutex> local_1c8;
  lock_guard<std::mutex> lock;
  char *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  string local_198;
  string local_178;
  string local_158;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string local_128;
  string local_108;
  Logger *local_e8;
  size_t sStack_e0;
  char *local_d8 [3];
  string_view local_c0;
  string local_b0;
  undefined1 local_90 [16];
  string local_80;
  char local_59;
  undefined1 local_58 [8];
  string msg;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  GenT genType_local;
  Logger *this_local;
  string_view message_local;
  
  pcVar2 = message._M_str;
  this_local = (Logger *)message._M_len;
  local_59 = '\n';
  msg.field_2._8_8_ = output;
  message_local._M_len = (size_t)pcVar2;
  local_c0 = cmQtAutoGen::GeneratorName(genType);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[18]>
            (&local_b0,&local_c0,(char (*) [18])" subprocess error");
  local_90 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
  title._M_len = local_90._8_8_;
  title._M_str = pcVar2;
  HeadLine_abi_cxx11_(&local_80,local_90._0_8_,title);
  local_e8 = this_local;
  sStack_e0 = message_local._M_len;
  sVar3._M_str = (char *)message_local._M_len;
  sVar3._M_len = (size_t)this_local;
  bVar1 = cmHasSuffix(sVar3,'\n');
  local_d8[0] = "\n\n";
  if (bVar1) {
    local_d8[0] = "\n";
  }
  args = (basic_string_view<char,_std::char_traits<char>_> *)&this_local;
  cmStrCat<char,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>&,char_const*>
            ((string *)local_58,&local_59,&local_80,args,local_d8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"Command");
  title_00._M_str = (char *)args;
  title_00._M_len = (size_t)local_138._M_str;
  HeadLine_abi_cxx11_(&local_128,(Logger *)local_138._M_len,title_00);
  cmQtAutoGen::QuotedCommand(&local_158,command);
  pcVar2 = "\n\n";
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[3]>
            (&local_108,&local_128,&local_158,(char (*) [3])0x102eca1);
  std::__cxx11::string::operator+=((string *)local_58,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_128);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"Output");
  title_01._M_str = pcVar2;
  title_01._M_len = (size_t)local_1a8._M_str;
  HeadLine_abi_cxx11_(&local_198,(Logger *)local_1a8._M_len,title_01);
  b = msg.field_2._8_8_;
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)msg.field_2._8_8_);
  lock._M_device = (mutex_type *)sVar3._M_len;
  bVar1 = cmHasSuffix(sVar3,'\n');
  local_1b0 = "\n\n";
  if (bVar1) {
    local_1b0 = "\n";
  }
  cmStrCat<std::__cxx11::string,std::__cxx11::string_const&,char_const*>
            (&local_178,&local_198,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b,&local_1b0);
  std::__cxx11::string::operator+=((string *)local_58,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::lock_guard<std::mutex>::lock_guard(&local_1c8,&this->Mutex_);
  cmSystemTools::Stderr((string *)local_58);
  std::lock_guard<std::mutex>::~lock_guard(&local_1c8);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}